

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O1

int Raig_ManSimulateRound(Raig_Man_t *p,int fMiter,int fFirst,int *piPat)

{
  int i;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int i_00;
  ulong uVar15;
  bool bVar16;
  int local_40;
  
  pVVar4 = p->vCis2Ids;
  if (0 < pVVar4->nSize) {
    lVar13 = 0;
    do {
      iVar14 = pVVar4->pArray[lVar13];
      uVar1 = iVar14 - p->nPis;
      if (p->nPis <= iVar14) {
        if (((int)uVar1 < 0) || (p->vLos->nSize <= (int)uVar1)) goto LAB_00665d98;
        puVar5 = Raig_ManSimRef(p,p->vLos->pArray[uVar1]);
        if (fFirst == 0) {
          uVar1 = iVar14 - p->nPis;
          if (((int)uVar1 < 0) || (p->vLis->nSize <= (int)uVar1)) goto LAB_00665d98;
          puVar6 = Raig_ManSimDeref(p,p->vLis->pArray[uVar1]);
          if (0 < p->nWords) {
            lVar9 = 0;
            do {
              puVar5[lVar9 + 1] = puVar6[lVar9 + 1];
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nWords);
          }
        }
        else {
          memset(puVar5 + 1,0,(long)p->nWords << 2);
        }
        if (*puVar5 == 0) {
          *puVar5 = 1;
          uVar1 = iVar14 - p->nPis;
          if (((int)uVar1 < 0) || (p->vLos->nSize <= (int)uVar1)) goto LAB_00665d98;
          Raig_ManSimDeref(p,p->vLos->pArray[uVar1]);
        }
      }
      lVar13 = lVar13 + 1;
      pVVar4 = p->vCis2Ids;
    } while (lVar13 < pVVar4->nSize);
  }
  uVar1 = 0;
  iVar14 = 0;
  if (2 < p->nObjs) {
    iVar14 = 0;
    uVar15 = 2;
    uVar1 = 0;
    do {
      i_00 = (int)uVar15;
      if (p->pFans0[uVar15] == 0) {
        if (((int)uVar1 < 0) || (p->vCis2Ids->nSize <= (int)uVar1)) {
LAB_00665d98:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = p->vCis2Ids->pArray[uVar1];
        uVar2 = iVar10 - p->nPis;
        if (iVar10 < p->nPis) {
          puVar5 = Raig_ManSimRef(p,i_00);
          if (0 < p->nWords) {
            lVar13 = 0;
            do {
              uVar2 = Aig_ManRandom(0);
              puVar5[lVar13 + 1] = uVar2;
              lVar13 = lVar13 + 1;
            } while (lVar13 < p->nWords);
          }
          if (*puVar5 == 0) {
            *puVar5 = 1;
            Raig_ManSimDeref(p,i_00);
          }
        }
        else {
          if (((int)uVar2 < 0) || (p->vLos->nSize <= (int)uVar2)) goto LAB_00665d98;
          if (uVar15 != (uint)p->vLos->pArray[uVar2]) {
            __assert_fail("Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                          ,0x15d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
          }
        }
        uVar1 = uVar1 + 1;
      }
      else if (p->pFans1[uVar15] == 0) {
        puVar5 = Raig_ManSimDeref(p,p->pFans0[uVar15] >> 1);
        if ((fMiter == 0) || (p->nPos <= iVar14)) {
          puVar6 = Raig_ManSimRef(p,i_00);
          if (*puVar6 != 1) {
            __assert_fail("pRes[0] == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                          ,0x171,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
          }
          if ((*(byte *)(p->pFans0 + uVar15) & 1) == 0) {
            if (0 < p->nWords) {
              lVar13 = 0;
              do {
                puVar6[lVar13 + 1] = puVar5[lVar13 + 1];
                lVar13 = lVar13 + 1;
              } while (lVar13 < p->nWords);
            }
          }
          else if (0 < p->nWords) {
            lVar13 = 0;
            do {
              puVar6[lVar13 + 1] = ~puVar5[lVar13 + 1];
              lVar13 = lVar13 + 1;
            } while (lVar13 < p->nWords);
          }
        }
        else {
          uVar11 = (ulong)p->nWords;
          bVar16 = (long)uVar11 < 1;
          if (0 < (long)uVar11) {
            uVar8 = -(p->pFans0[uVar15] & 1U);
            uVar2 = puVar5[1];
            uVar3 = 0;
            iVar10 = 0;
            if (uVar2 == uVar8) {
              iVar10 = 0;
              uVar12 = 0;
              do {
                if ((ulong)(p->nWords + 1) - 2 == uVar12) {
                  bVar16 = uVar11 <= uVar12 + 1;
                  goto LAB_00665d41;
                }
                uVar2 = puVar5[uVar12 + 2];
                uVar12 = uVar12 + 1;
                iVar10 = iVar10 + 0x20;
              } while (uVar2 == uVar8);
              bVar16 = uVar11 <= uVar12;
            }
            do {
              if (((uVar2 ^ uVar8) >> (uVar3 & 0x1f) & 1) != 0) goto LAB_00665bdb;
              uVar3 = uVar3 + 1;
            } while (uVar3 != 0x20);
            uVar3 = 0xffffffff;
LAB_00665bdb:
            *piPat = iVar10 + uVar3;
            local_40 = i_00;
          }
LAB_00665d41:
          if (!bVar16) {
            return local_40;
          }
        }
        iVar14 = iVar14 + 1;
      }
      else {
        puVar5 = Raig_ManSimRef(p,i_00);
        if (*puVar5 == 0) {
          __assert_fail("pRes[0] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                        ,0x17d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
        }
        uVar2 = p->pFans0[uVar15];
        uVar3 = p->pFans1[uVar15];
        puVar6 = Raig_ManSimDeref(p,(int)uVar2 >> 1);
        puVar7 = Raig_ManSimDeref(p,p->pFans1[uVar15] >> 1);
        uVar8 = uVar3 & 1;
        if (((uVar2 & 1) == 0) || (uVar8 == 0)) {
          if (((uVar2 & 1) == 0) || (uVar8 != 0)) {
            if (((uVar2 & 1) == 0) && (uVar8 != 0)) {
              if (0 < p->nWords) {
                lVar13 = 0;
                do {
                  puVar5[lVar13 + 1] = ~puVar7[lVar13 + 1] & puVar6[lVar13 + 1];
                  lVar13 = lVar13 + 1;
                } while (lVar13 < p->nWords);
              }
            }
            else if ((((uVar2 | uVar3) & 1) == 0) && (0 < p->nWords)) {
              lVar13 = 0;
              do {
                puVar5[lVar13 + 1] = puVar7[lVar13 + 1] & puVar6[lVar13 + 1];
                lVar13 = lVar13 + 1;
              } while (lVar13 < p->nWords);
            }
          }
          else if (0 < p->nWords) {
            lVar13 = 0;
            do {
              puVar5[lVar13 + 1] = ~puVar6[lVar13 + 1] & puVar7[lVar13 + 1];
              lVar13 = lVar13 + 1;
            } while (lVar13 < p->nWords);
          }
        }
        else if (0 < p->nWords) {
          lVar13 = 0;
          do {
            puVar5[lVar13 + 1] = ~(puVar7[lVar13 + 1] | puVar6[lVar13 + 1]);
            lVar13 = lVar13 + 1;
          } while (lVar13 < p->nWords);
        }
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)p->nObjs);
  }
  if (uVar1 != p->nCis) {
    __assert_fail("nCis == p->nCis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,399,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  if (iVar14 == p->nCos) {
    if (p->nMems == p->vLis->nSize + 1) {
      return 0;
    }
    __assert_fail("p->nMems == 1 + Vec_IntSize(p->vLis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,0x191,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  __assert_fail("nCos == p->nCos",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                ,400,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
}

Assistant:

int Raig_ManSimulateRound( Raig_Man_t * p, int fMiter, int fFirst, int * piPat )
{ 
    unsigned * pRes0, * pRes1, * pRes;
    int i, w, nCis, nCos, iFan0, iFan1, iPioNum;
    // nove the values to the register outputs
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < p->nPis )
            continue;
        pRes = Raig_ManSimRef( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        if ( fFirst )
            memset( pRes + 1, 0, sizeof(unsigned) * p->nWords );
        else
        {
            pRes0 = Raig_ManSimDeref( p, Vec_IntEntry(p->vLis, iPioNum-p->nPis) );
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w];
        }
        // handle unused PIs
        if ( pRes[0] == 0 ) 
        {
            pRes[0] = 1;
            Raig_ManSimDeref( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        }
    }
    // simulate the logic
    nCis = nCos = 0;
    for ( i = 2; i < p->nObjs; i++ )
    {
        if ( p->pFans0[i] == 0 ) // ci always has zero first fanin
        {
            iPioNum = Vec_IntEntry( p->vCis2Ids, nCis );
            if ( iPioNum < p->nPis )
            {
                pRes = Raig_ManSimRef( p, i );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Aig_ManRandom( 0 );
                // handle unused PIs
                if ( pRes[0] == 0 ) 
                {
                    pRes[0] = 1;
                    Raig_ManSimDeref( p, i );
                }
            }
            else
                assert( Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i );
            nCis++;
            continue;
        }
        if ( p->pFans1[i] == 0 ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
            if ( nCos < p->nPos && fMiter )
            {
                unsigned Const = Raig_LitIsCompl(p->pFans0[i])? ~0 : 0;
                for ( w = 1; w <= p->nWords; w++ )
                    if ( pRes0[w] != Const )
                    {
                        *piPat = 32*(w-1) + Aig_WordFindFirstBit( pRes0[w] ^ Const );
                        return i;
                    }
            }
            else
            {
                pRes = Raig_ManSimRef( p, i );
                assert( pRes[0] == 1 );
                if ( Raig_LitIsCompl(p->pFans0[i]) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = ~pRes0[w];
                else
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = pRes0[w];
            }
            nCos++;
            continue;
        }
        pRes  = Raig_ManSimRef( p, i );
        assert( pRes[0] > 0 );
        iFan0 = p->pFans0[i];
        iFan1 = p->pFans1[i];
        pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
        pRes1 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans1[i]) );
        if ( Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~(pRes0[w] | pRes1[w]);
        else if ( Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~pRes0[w] & pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & ~pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & pRes1[w];
    }
    assert( nCis == p->nCis );
    assert( nCos == p->nCos );
    assert( p->nMems == 1 + Vec_IntSize(p->vLis) );
    return 0;
}